

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantMarkUsedCis(Gia_Man_t *p,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  word *__s;
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (p->vSuppWords->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  __s = p->vSuppWords->pArray;
  lVar3 = (long)p->nSuppWords;
  if (0 < lVar3) {
    lVar2 = 0;
    memset(__s,0,lVar3 * 8);
    do {
      if (__s[lVar2] != 0) {
        __assert_fail("Abc_TtIsConst0(pInfo, p->nSuppWords)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                      ,0xac,
                      "void Gia_ManQuantMarkUsedCis(Gia_Man_t *, int (*)(void *, int), void *)");
      }
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  if (0 < (p->vSuppVars).nSize) {
    uVar4 = 0;
    do {
      iVar1 = (*pFuncCiToKeep)(pData,(p->vSuppVars).pArray[uVar4]);
      if (iVar1 == 0) {
        __s[uVar4 >> 6 & 0x3ffffff] = __s[uVar4 >> 6 & 0x3ffffff] | 1L << ((byte)uVar4 & 0x3f);
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)(p->vSuppVars).nSize);
  }
  return;
}

Assistant:

void Gia_ManQuantMarkUsedCis( Gia_Man_t * p, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int i, CiId;
    word * pInfo = Gia_ManQuantInfoId( p, 0 );
    Abc_TtClear( pInfo, p->nSuppWords );
    assert( Abc_TtIsConst0(pInfo, p->nSuppWords) );
    Vec_IntForEachEntry( &p->vSuppVars, CiId, i )
        if ( !pFuncCiToKeep( pData, CiId ) ) // quant var
            Abc_TtSetBit( pInfo, i );
}